

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  ulong uVar1;
  bool bVar2;
  IStream *__p;
  ITagAliasRegistry *tagAliases;
  size_type sVar3;
  const_reference arg;
  TestSpec local_b8;
  ulong local_a0;
  size_t i;
  TestSpecParser parser;
  ConfigData *data_local;
  Config *this_local;
  
  SharedImpl<Catch::IConfig>::SharedImpl(&this->super_SharedImpl<Catch::IConfig>);
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001fb078;
  ConfigData::ConfigData(&this->m_data,data);
  __p = openStream(this);
  std::unique_ptr<Catch::IStream_const,std::default_delete<Catch::IStream_const>>::
  unique_ptr<std::default_delete<Catch::IStream_const>,void>
            ((unique_ptr<Catch::IStream_const,std::default_delete<Catch::IStream_const>> *)
             &this->m_stream,__p);
  TestSpec::TestSpec(&this->m_testSpec);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&data->testsOrTags);
  if (!bVar2) {
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser((TestSpecParser *)&i,tagAliases);
    local_a0 = 0;
    while( true ) {
      uVar1 = local_a0;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&data->testsOrTags);
      if (sVar3 <= uVar1) break;
      arg = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&data->testsOrTags,local_a0);
      TestSpecParser::parse((TestSpecParser *)&i,arg);
      local_a0 = local_a0 + 1;
    }
    TestSpecParser::testSpec(&local_b8,(TestSpecParser *)&i);
    TestSpec::operator=(&this->m_testSpec,&local_b8);
    TestSpec::~TestSpec(&local_b8);
    TestSpecParser::~TestSpecParser((TestSpecParser *)&i);
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_stream( openStream() )
        {
            if( !data.testsOrTags.empty() ) {
                TestSpecParser parser( ITagAliasRegistry::get() );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i )
                    parser.parse( data.testsOrTags[i] );
                m_testSpec = parser.testSpec();
            }
        }